

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

bool filemgr_is_commit_header(void *head_buffer,size_t blocksize)

{
  ulong uVar1;
  bool bVar2;
  
  if (*(char *)((long)head_buffer + (blocksize - 1)) == -0x12) {
    uVar1 = *(ulong *)((long)head_buffer + (blocksize - 9));
    bVar2 = ver_is_valid_magic(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                               (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                               (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                               (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
    return bVar2;
  }
  return false;
}

Assistant:

bool filemgr_is_commit_header(void *head_buffer, size_t blocksize)
{
    uint8_t marker[BLK_MARKER_SIZE];
    filemgr_magic_t magic;
    marker[0] = *(((uint8_t *)head_buffer)
                 + blocksize - BLK_MARKER_SIZE);
    if (marker[0] != BLK_MARKER_DBHEADER) {
        return false;
    }

    memcpy(&magic, (uint8_t *) head_buffer
            + blocksize - BLK_MARKER_SIZE - sizeof(magic), sizeof(magic));
    magic = _endian_decode(magic);

    return ver_is_valid_magic(magic);
}